

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O3

void dmrC_dump_macro_definitions(dmr_C *C)

{
  ident *ident;
  symbol *sym;
  undefined1 local_38 [8];
  ptr_list_iter nameiter__;
  
  ptrlist_forward_iterator((ptr_list_iter *)local_38,(ptr_list *)C->macros);
  ident = (ident *)ptrlist_iter_next((ptr_list_iter *)local_38);
  while (ident != (ident *)0x0) {
    sym = dmrC_lookup_symbol(ident,NS_UNDEF|NS_MACRO);
    if ((sym != (symbol *)0x0) &&
       (((undefined1  [232])*sym & (undefined1  [232])0x1ff00) == (undefined1  [232])0x100)) {
      dump_macro(C,sym);
    }
    ident = (ident *)ptrlist_iter_next((ptr_list_iter *)local_38);
  }
  return;
}

Assistant:

void dmrC_dump_macro_definitions(struct dmr_C *C)
{
	struct ident *name;

	FOR_EACH_PTR(C->macros, name) {
		struct symbol *sym = lookup_macro(C, name);
		if (sym)
			dump_macro(C, sym);
	} END_FOR_EACH_PTR(name);
}